

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFExporter::ExportAnimations(glTFExporter *this)

{
  element_type *peVar1;
  char *pcVar2;
  Animation *pAVar3;
  Ref<glTF::Buffer> RVar4;
  Ref<glTF::Animation> RVar5;
  Ref<glTF::Node> RVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  AnimSampler tmpAnimSampler;
  AnimChannel tmpAnimChannel;
  undefined1 local_148 [4];
  int channelSize;
  string channelType;
  uint j;
  undefined1 local_110 [8];
  Ref<glTF::Animation> animRef;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string name;
  aiNodeAnim *nodeChannel;
  uint channelIndex;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string nameAnim;
  aiAnimation *anim;
  uint i;
  undefined1 local_20 [8];
  Ref<glTF::Buffer> bufferRef;
  glTFExporter *this_local;
  
  bufferRef._8_8_ = this;
  peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  RVar4 = glTF::LazyDict<glTF::Buffer>::Get(&peVar1->buffers,0);
  local_20 = (undefined1  [8])RVar4.vector;
  bufferRef.vector._0_4_ = RVar4.index;
  for (anim._4_4_ = 0; anim._4_4_ < this->mScene->mNumAnimations; anim._4_4_ = anim._4_4_ + 1) {
    nameAnim.field_2._8_8_ = this->mScene->mAnimations[anim._4_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"anim",&local_61);
    std::allocator<char>::~allocator(&local_61);
    if (*(int *)nameAnim.field_2._8_8_ != 0) {
      pcVar2 = aiString::C_Str((aiString *)nameAnim.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_60,pcVar2);
    }
    for (nodeChannel._0_4_ = 0; (uint)nodeChannel < *(uint *)(nameAnim.field_2._8_8_ + 0x418);
        nodeChannel._0_4_ = (uint)nodeChannel + 1) {
      name.field_2._8_8_ =
           *(undefined8 *)(*(long *)(nameAnim.field_2._8_8_ + 0x420) + (ulong)(uint)nodeChannel * 8)
      ;
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_");
      to_string<unsigned_int>(&local_e0,(uint)nodeChannel);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_c0,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      glTF::Asset::FindUniqueID((string *)&animRef.index,peVar1,(string *)local_a0,"animation");
      std::__cxx11::string::operator=((string *)local_a0,(string *)&animRef.index);
      std::__cxx11::string::~string((string *)&animRef.index);
      peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      RVar5 = glTF::LazyDict<glTF::Animation>::Create(&peVar1->animations,(string *)local_a0);
      local_110 = (undefined1  [8])RVar5.vector;
      animRef.vector._0_4_ = RVar5.index;
      peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mAsset);
      ExtractAnimationData
                (peVar1,(string *)local_a0,(Ref<glTF::Animation> *)local_110,
                 (Ref<glTF::Buffer> *)local_20,(aiNodeAnim *)name.field_2._8_8_,
                 (float)*(double *)(nameAnim.field_2._8_8_ + 0x410));
      for (channelType.field_2._12_4_ = 0; (uint)channelType.field_2._12_4_ < 3;
          channelType.field_2._12_4_ = channelType.field_2._12_4_ + 1) {
        std::__cxx11::string::string((string *)local_148);
        if (channelType.field_2._12_4_ == 0) {
          std::__cxx11::string::operator=((string *)local_148,"rotation");
          tmpAnimChannel.target.path.field_2._12_4_ = *(undefined4 *)(name.field_2._8_8_ + 0x410);
        }
        else if (channelType.field_2._12_4_ == 1) {
          std::__cxx11::string::operator=((string *)local_148,"scale");
          tmpAnimChannel.target.path.field_2._12_4_ = *(undefined4 *)(name.field_2._8_8_ + 0x420);
        }
        else if (channelType.field_2._12_4_ == 2) {
          std::__cxx11::string::operator=((string *)local_148,"translation");
          tmpAnimChannel.target.path.field_2._12_4_ = *(undefined4 *)(name.field_2._8_8_ + 0x404);
        }
        if ((int)tmpAnimChannel.target.path.field_2._12_4_ < 1) {
          tmpAnimChannel.target.path.field_2._8_4_ = 10;
        }
        else {
          glTF::Animation::AnimChannel::AnimChannel
                    ((AnimChannel *)((long)&tmpAnimSampler.output.field_2 + 8));
          glTF::Animation::AnimSampler::AnimSampler((AnimSampler *)local_220);
          std::operator+(&local_260,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,"_");
          std::operator+(&local_240,&local_260,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
          std::__cxx11::string::operator=
                    ((string *)(tmpAnimSampler.output.field_2._M_local_buf + 8),(string *)&local_240
                    );
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::operator=
                    ((string *)&tmpAnimChannel.target.id.index,(string *)local_148);
          std::__cxx11::string::operator=
                    ((string *)(tmpAnimSampler.interpolation.field_2._M_local_buf + 8),
                     (string *)local_148);
          std::operator+(&local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,"_");
          std::operator+(&local_280,&local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
          std::__cxx11::string::operator=((string *)local_220,(string *)&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_2a0);
          peVar1 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mAsset);
          pcVar2 = aiString::C_Str((aiString *)name.field_2._8_8_);
          RVar6 = glTF::LazyDict<glTF::Node>::Get(&peVar1->nodes,pcVar2);
          tmpAnimChannel.sampler.field_2._8_8_ = RVar6.vector;
          tmpAnimChannel.target.id.vector._0_4_ = RVar6.index;
          std::__cxx11::string::operator=
                    ((string *)(tmpAnimSampler.id.field_2._M_local_buf + 8),"TIME");
          std::__cxx11::string::operator=
                    ((string *)(tmpAnimSampler.input.field_2._M_local_buf + 8),"LINEAR");
          pAVar3 = glTF::Ref<glTF::Animation>::operator->((Ref<glTF::Animation> *)local_110);
          std::vector<glTF::Animation::AnimChannel,_std::allocator<glTF::Animation::AnimChannel>_>::
          push_back(&pAVar3->Channels,(value_type *)((long)&tmpAnimSampler.output.field_2 + 8));
          pAVar3 = glTF::Ref<glTF::Animation>::operator->((Ref<glTF::Animation> *)local_110);
          std::vector<glTF::Animation::AnimSampler,_std::allocator<glTF::Animation::AnimSampler>_>::
          push_back(&pAVar3->Samplers,(value_type *)local_220);
          glTF::Animation::AnimSampler::~AnimSampler((AnimSampler *)local_220);
          glTF::Animation::AnimChannel::~AnimChannel
                    ((AnimChannel *)((long)&tmpAnimSampler.output.field_2 + 8));
          tmpAnimChannel.target.path.field_2._8_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_148);
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void glTFExporter::ExportAnimations()
{
    Ref<Buffer> bufferRef = mAsset->buffers.Get(unsigned (0));

    for (unsigned int i = 0; i < mScene->mNumAnimations; ++i) {
        const aiAnimation* anim = mScene->mAnimations[i];

        std::string nameAnim = "anim";
        if (anim->mName.length > 0) {
            nameAnim = anim->mName.C_Str();
        }

        for (unsigned int channelIndex = 0; channelIndex < anim->mNumChannels; ++channelIndex) {
            const aiNodeAnim* nodeChannel = anim->mChannels[channelIndex];

            // It appears that assimp stores this type of animation as multiple animations.
            // where each aiNodeAnim in mChannels animates a specific node.
            std::string name = nameAnim + "_" + to_string(channelIndex);
            name = mAsset->FindUniqueID(name, "animation");
            Ref<Animation> animRef = mAsset->animations.Create(name);

            /******************* Parameters ********************/
            ExtractAnimationData(*mAsset, name, animRef, bufferRef, nodeChannel, static_cast<float>(anim->mTicksPerSecond));

            for (unsigned int j = 0; j < 3; ++j) {
                std::string channelType;
                int channelSize;
                switch (j) {
                    case 0:
                        channelType = "rotation";
                        channelSize = nodeChannel->mNumRotationKeys;
                        break;
                    case 1:
                        channelType = "scale";
                        channelSize = nodeChannel->mNumScalingKeys;
                        break;
                    case 2:
                        channelType = "translation";
                        channelSize = nodeChannel->mNumPositionKeys;
                        break;
                }

                if (channelSize < 1) { continue; }

                Animation::AnimChannel tmpAnimChannel;
                Animation::AnimSampler tmpAnimSampler;

                tmpAnimChannel.sampler = name + "_" + channelType;
                tmpAnimChannel.target.path = channelType;
                tmpAnimSampler.output = channelType;
                tmpAnimSampler.id = name + "_" + channelType;

                tmpAnimChannel.target.id = mAsset->nodes.Get(nodeChannel->mNodeName.C_Str());

                tmpAnimSampler.input = "TIME";
                tmpAnimSampler.interpolation = "LINEAR";

                animRef->Channels.push_back(tmpAnimChannel);
                animRef->Samplers.push_back(tmpAnimSampler);
            }

        }

        // Assimp documentation staes this is not used (not implemented)
        // for (unsigned int channelIndex = 0; channelIndex < anim->mNumMeshChannels; ++channelIndex) {
        //     const aiMeshAnim* meshChannel = anim->mMeshChannels[channelIndex];
        // }

    } // End: for-loop mNumAnimations
}